

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O0

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe18At3(uint8_t *buf)

{
  uint64_t res;
  uint8_t *buf_local;
  
  return (long)((int)(uint)buf[2] >> 3) | ((ulong)CONCAT11(*buf,buf[1]) & 0x1fff) << 5;
}

Assistant:

std::uint64_t readFlUIntBe18At3(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 5;
    res |= (buf[2] >> 3);
    res &= UINT64_C(0x3ffff);
    return res;
}